

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpplocate.cpp
# Opt level: O1

string * cpplocate::configDir(string *__return_storage_ptr__,string *application)

{
  uint applicationLength;
  uint length;
  char *dir;
  uint local_24;
  _anonymous_namespace_ *local_20;
  
  local_20 = (_anonymous_namespace_ *)0x0;
  local_24 = 0;
  applicationLength = (uint)application->_M_string_length;
  ::configDir((char **)&local_20,&local_24,(application->_M_dataplus)._M_p,applicationLength);
  (anonymous_namespace)::obtainStringFromLibLocate_abi_cxx11_
            (__return_storage_ptr__,local_20,(char *)(ulong)local_24,applicationLength);
  return __return_storage_ptr__;
}

Assistant:

std::string configDir(const std::string & application)
{
    char * dir = nullptr;
    unsigned int length = 0;

    ::configDir(&dir, &length, application.c_str(), (unsigned int)application.size());

    // Convert to string and free memory from liblocate
    return obtainStringFromLibLocate(dir, length);
}